

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O3

TValue * luaT_gettmbyobj(lua_State *L,TValue *o,TMS event)

{
  code cVar1;
  byte bVar2;
  ushort uVar3;
  Table *pTVar4;
  TString *key;
  TString *pTVar5;
  uint uVar6;
  Table **ppTVar7;
  TValue *pTVar8;
  ushort uVar9;
  Node *n;
  char *pcVar10;
  
  uVar3 = o->tt_;
  uVar9 = uVar3 & 0x7f;
  uVar6 = (uint)uVar3;
  if (uVar9 < 0x15) {
    if (uVar9 == 5) {
      if (uVar6 != 0x8005) {
        pcVar10 = "((((o))->tt_) == (((5) | (1 << 15))))";
LAB_001273e8:
        __assert_fail(pcVar10,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x4e,"const TValue *luaT_gettmbyobj(lua_State *, const TValue *, TMS)");
      }
      if ((o->value_).f[8] != (_func_int_lua_State_ptr)0x5) {
        pcVar10 = "(((o)->value_).gc)->tt == 5";
        goto LAB_001273e8;
      }
      ppTVar7 = (Table **)((o->value_).f + 0x28);
    }
    else {
      if (uVar9 != 7) goto LAB_001272ac;
      if (uVar6 != 0x8007) {
        pcVar10 = "((((o))->tt_) == (((7) | (1 << 15))))";
LAB_001273c9:
        __assert_fail(pcVar10,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x51,"const TValue *luaT_gettmbyobj(lua_State *, const TValue *, TMS)");
      }
      if ((o->value_).f[8] != (_func_int_lua_State_ptr)0x7) {
        pcVar10 = "(((o)->value_).gc)->tt == 7";
        goto LAB_001273c9;
      }
      ppTVar7 = (Table **)((o->value_).f + 0x10);
    }
  }
  else if ((uVar9 == 0x25) || (uVar9 == 0x15)) {
    if ((uVar3 != 0x8015) && (uVar6 != 0x8025)) {
      pcVar10 = 
      "(((((o))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((o))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_001273a1:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x4b,"const TValue *luaT_gettmbyobj(lua_State *, const TValue *, TMS)");
    }
    cVar1 = (o->value_).f[8];
    if ((cVar1 != (code)0x15) && (cVar1 != (code)0x25)) {
      pcVar10 = 
      "((((o)->value_).gc)->tt == ((5) | ((1) << 4)) || (((o)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_001273a1;
    }
    ppTVar7 = (Table **)((o->value_).f + 0x38);
  }
  else {
LAB_001272ac:
    ppTVar7 = L->l_G->mt + (uVar6 & 0xf);
  }
  pTVar4 = *ppTVar7;
  if (pTVar4 != (Table *)0x0) {
    key = L->l_G->tmname[event];
    if (key->tt != '\x04') {
      __assert_fail("key->tt == ((4) | ((0) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    n = pTVar4->node + (pTVar4->hmask & key->hash);
    if ((n->i_key).nk.tt_ == 0x8004) {
      pTVar5 = (TString *)(n->i_key).nk.value_.gc;
      bVar2 = pTVar5->tt;
      if ((bVar2 & 0xf) != 4) {
        pcVar10 = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
LAB_00127370:
        __assert_fail(pcVar10,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                      ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
      }
      if (bVar2 != 4) {
        pcVar10 = 
        "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
        ;
        goto LAB_00127370;
      }
      if (pTVar5 == key) {
        return &n->i_val;
      }
    }
    if ((n->i_key).nk.next != 0) {
      pTVar8 = luaH_getshortstr_continue(key,n);
      return pTVar8;
    }
  }
  return &luaO_nilobject_;
}

Assistant:

const TValue *luaT_gettmbyobj (lua_State *L, const TValue *o, TMS event) {
  Table *mt;
  switch (ttype(o)) {
    case RAVI_TIARRAY:
    case RAVI_TFARRAY:
      mt = arrvalue(o)->metatable;
      break;
    case LUA_TTABLE:
      mt = hvalue(o)->metatable;
      break;
    case LUA_TUSERDATA:
      mt = uvalue(o)->metatable;
      break;
    default:
      mt = G(L)->mt[ttnov(o)];
  }
  return (mt ? luaH_getshortstr(mt, G(L)->tmname[event]) : luaO_nilobject);
}